

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O2

void benchmark_wmutex_uncontended(testing t)

{
  int iVar1;
  nsync_pthread_rwlock_s *this;
  bool bVar2;
  nsync_pthread_rwlock_ mu;
  
  iVar1 = testing_n(t);
  this = (nsync_pthread_rwlock_s *)operator_new(0x60);
  nsync_pthread_rwlock_s::nsync_pthread_rwlock_s(this);
  mu = this;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    nsync_pthread_rwlock_wrlock_(&mu);
    nsync_pthread_rwlock_unlock_(&mu);
  }
  std::condition_variable::~condition_variable(&this->cv);
  operator_delete(this);
  return;
}

Assistant:

static void benchmark_wmutex_uncontended (testing t) {
	int i;
	int n = testing_n (t);
	pthread_rwlock_t mu;
	pthread_rwlock_init (&mu, NULL);
	for (i = 0; i != n; i++) {
		pthread_rwlock_wrlock (&mu);
		pthread_rwlock_unlock (&mu);
	}
	pthread_rwlock_destroy (&mu);
}